

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

bool __thiscall
math::wide_integer::uintwide_t<32768u,unsigned_int,void,false>::wr_string<char*>
          (uintwide_t<32768u,unsigned_int,void,false> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  char cVar1;
  unsigned_fast_type uVar2;
  byte bVar3;
  ulong uVar4;
  bool bVar5;
  size_type sVar6;
  uint uVar7;
  const_iterator puVar8;
  byte *pbVar9;
  reference pvVar10;
  pointer pvVar11;
  uintwide_t<24U,_unsigned_char,_void,_false> *v;
  value_type local_6189;
  ulong local_60e0;
  unsigned_fast_type local_60d8;
  unsigned_fast_type dst;
  signed_fast_type pos_2;
  undefined1 local_60c0 [8];
  string_storage_hex_type str_temp_2;
  uintwide_t<24U,_unsigned_char,_void,_false> t_2;
  ulong local_50a8;
  uintwide_t<32768U,_unsigned_int,_void,_false> local_50a0 [4096];
  wide_integer local_40a0 [4096];
  uintwide_t<24U,_unsigned_char,_void,_false> local_30a0 [2];
  uintwide_t<24U,_unsigned_char,_void,_false> tmp;
  ulong local_20a0;
  signed_fast_type pos_1;
  undefined1 local_2090 [8];
  string_storage_dec_type str_temp_1;
  uintwide_t<32768U,_unsigned_int,_void,_false> local_2070 [7];
  bool str_has_neg_sign;
  uintwide_t<24U,_unsigned_char,_void,_false> t_1;
  ulong local_1070;
  byte local_1061;
  ulong uStack_1060;
  char c;
  signed_fast_type pos;
  allocator_type local_1042;
  value_type local_1041;
  undefined1 local_1040 [8];
  string_storage_oct_type str_temp;
  undefined1 local_1020 [4];
  limb_type mask;
  uintwide_t<24U,_unsigned_char,_void,_false> t;
  bool local_1d;
  bool wr_string_is_ok;
  bool is_uppercase_local;
  bool show_pos_local;
  bool show_base_local;
  uint_fast8_t base_rep_local;
  char *str_result_local;
  uintwide_t<24U,_unsigned_char,_void,_false> *this_local;
  
  local_1d = true;
  if (base_rep == '\b') {
    memcpy(local_1020,this,0x1000);
    str_temp.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems._4_4_
         = 7;
    local_1041 = '\0';
    std::allocator<char>::allocator();
    detail::fixed_dynamic_array<char,_10931U,_std::allocator<unsigned_int>_>::fixed_dynamic_array
              ((fixed_dynamic_array<char,_10931U,_std::allocator<unsigned_int>_> *)local_1040,0x2ab3
               ,&local_1041,&local_1042);
    std::allocator<char>::~allocator(&local_1042);
    sVar6 = detail::fixed_dynamic_array<char,_10931U,_std::allocator<unsigned_int>_>::static_size();
    uStack_1060 = (ulong)(sVar6 - 1);
    bVar5 = uintwide_t<32768U,_unsigned_int,_void,_false>::is_zero
                      ((uintwide_t<32768U,_unsigned_int,_void,_false> *)local_1020);
    if (bVar5) {
      uStack_1060 = uStack_1060 - 1;
      pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                           local_1040,(size_type)uStack_1060);
      *pvVar10 = '0';
    }
    else {
      while (bVar5 = uintwide_t<32768U,_unsigned_int,_void,_false>::is_zero
                               ((uintwide_t<32768U,_unsigned_int,_void,_false> *)local_1020),
            !bVar5 && 0 < (long)uStack_1060) {
        puVar8 = detail::array_detail::array<unsigned_int,_1024UL>::cbegin
                           ((array<unsigned_int,_1024UL> *)local_1020);
        local_1061 = (byte)*puVar8 & 7;
        if (local_1061 < 9) {
          local_1061 = local_1061 + 0x30;
        }
        bVar3 = local_1061;
        uStack_1060 = uStack_1060 - 1;
        pbVar9 = (byte *)util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>
                         ::operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                       *)local_1040,(size_type)uStack_1060);
        *pbVar9 = bVar3;
        operator>>=((uintwide_t<32768u,unsigned_int,void,false> *)local_1020,3);
      }
    }
    if ((show_base) && (0 < (long)uStack_1060)) {
      uStack_1060 = uStack_1060 - 1;
      pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                           local_1040,(size_type)uStack_1060);
      *pvVar10 = '0';
    }
    if ((show_pos) && (0 < (long)uStack_1060)) {
      uStack_1060 = uStack_1060 - 1;
      pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                           local_1040,(size_type)uStack_1060);
      *pvVar10 = '+';
    }
    if (field_width != 0) {
      sVar6 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::size
                        ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                         local_1040);
      local_1070 = (ulong)(sVar6 - 1);
      field_width = detail::min_unsafe<unsigned_long>(&field_width,&local_1070);
      while (uVar4 = uStack_1060,
            sVar6 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::size
                              ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                *)local_1040), cVar1 = fill_char_str,
            (long)((sVar6 - 1) - field_width) < (long)uVar4) {
        uStack_1060 = uStack_1060 - 1;
        pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                  operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *
                             )local_1040,(size_type)uStack_1060);
        *pvVar10 = cVar1;
      }
    }
    sVar6 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::size
                      ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                       local_1040);
    pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::operator[]
                        ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                         local_1040,sVar6 - 1);
    *pvVar10 = '\0';
    pvVar11 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::data
                        ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                         local_1040);
    detail::strcpy_unsafe<char*,char*>(str_result,pvVar11 + uStack_1060);
    detail::fixed_dynamic_array<char,_10931U,_std::allocator<unsigned_int>_>::~fixed_dynamic_array
              ((fixed_dynamic_array<char,_10931U,_std::allocator<unsigned_int>_> *)local_1040);
  }
  else if (base_rep == '\n') {
    memcpy(local_2070,this,0x1000);
    str_temp_1.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems.
    _7_1_ = 0;
    pos_1._7_1_ = 0;
    std::allocator<char>::allocator();
    detail::fixed_dynamic_array<char,_9873U,_std::allocator<unsigned_int>_>::fixed_dynamic_array
              ((fixed_dynamic_array<char,_9873U,_std::allocator<unsigned_int>_> *)local_2090,0x2691,
               (value_type *)((long)&pos_1 + 7),(allocator_type *)((long)&pos_1 + 6));
    std::allocator<char>::~allocator((allocator<char> *)((long)&pos_1 + 6));
    sVar6 = detail::fixed_dynamic_array<char,_9873U,_std::allocator<unsigned_int>_>::static_size();
    local_20a0 = (ulong)(sVar6 - 1);
    bVar5 = uintwide_t<32768U,_unsigned_int,_void,_false>::is_zero(local_2070);
    if (bVar5) {
      local_20a0 = local_20a0 - 1;
      pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                           local_2090,(size_type)local_20a0);
      *pvVar10 = '0';
    }
    else {
      while (bVar5 = uintwide_t<32768U,_unsigned_int,_void,_false>::is_zero(local_2070),
            !bVar5 && 0 < (long)local_20a0) {
        memcpy(local_30a0,local_2070,0x1000);
        uintwide_t<32768U,_unsigned_int,_void,_false>::eval_divide_by_single_limb
                  (local_2070,10,0,(uintwide_t<24U,_unsigned_char,_void,_false> *)0x0);
        memcpy(local_50a0,local_2070,0x1000);
        v = uintwide_t<32768U,_unsigned_int,_void,_false>::mul_by_limb(local_50a0,10);
        wide_integer::operator-(local_40a0,local_30a0,v);
        uVar7 = wide_integer::uintwide_t::operator_cast_to_unsigned_int((uintwide_t *)local_40a0);
        local_20a0 = local_20a0 - 1;
        pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                  operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *
                             )local_2090,(size_type)local_20a0);
        *pvVar10 = (char)uVar7 + '0';
      }
    }
    if ((0 < (long)local_20a0) && (show_pos)) {
      local_20a0 = local_20a0 - 1;
      pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                           local_2090,(size_type)local_20a0);
      *pvVar10 = '+';
    }
    if (field_width != 0) {
      sVar6 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::size
                        ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                         local_2090);
      local_50a8 = (ulong)(sVar6 - 1);
      field_width = detail::min_unsafe<unsigned_long>(&field_width,&local_50a8);
      while (sVar6 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                     size((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                          local_2090), cVar1 = fill_char_str,
            (long)((sVar6 - 1) - field_width) < (long)local_20a0) {
        local_20a0 = local_20a0 - 1;
        pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                  operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *
                             )local_2090,(size_type)local_20a0);
        *pvVar10 = cVar1;
      }
    }
    sVar6 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::size
                      ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                       local_2090);
    pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::operator[]
                        ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                         local_2090,sVar6 - 1);
    *pvVar10 = '\0';
    pvVar11 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::data
                        ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                         local_2090);
    detail::strcpy_unsafe<char*,char*>(str_result,pvVar11 + local_20a0);
    detail::fixed_dynamic_array<char,_9873U,_std::allocator<unsigned_int>_>::~fixed_dynamic_array
              ((fixed_dynamic_array<char,_9873U,_std::allocator<unsigned_int>_> *)local_2090);
  }
  else if (base_rep == '\x10') {
    memcpy(&str_temp_2.super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.
            elems,this,0x1000);
    pos_2._7_1_ = 0;
    std::allocator<char>::allocator();
    detail::fixed_dynamic_array<char,_8200U,_std::allocator<unsigned_int>_>::fixed_dynamic_array
              ((fixed_dynamic_array<char,_8200U,_std::allocator<unsigned_int>_> *)local_60c0,0x2008,
               (value_type *)((long)&pos_2 + 7),(allocator_type *)((long)&pos_2 + 6));
    std::allocator<char>::~allocator((allocator<char> *)((long)&pos_2 + 6));
    sVar6 = detail::fixed_dynamic_array<char,_8200U,_std::allocator<unsigned_int>_>::static_size();
    dst = (unsigned_fast_type)(sVar6 - 1);
    bVar5 = uintwide_t<32768U,_unsigned_int,_void,_false>::is_zero
                      ((uintwide_t<32768U,_unsigned_int,_void,_false> *)
                       &str_temp_2.
                        super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>.
                        elems);
    if (bVar5) {
      dst = dst - 1;
      pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                           local_60c0,(size_type)dst);
      *pvVar10 = '0';
    }
    else {
      pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                           local_60c0,(size_type)dst);
      local_60d8 = uintwide_t<32768U,_unsigned_int,_void,_false>::extract_hex_digits<false,_nullptr>
                             ((uintwide_t<24U,_unsigned_char,_void,_false> *)
                              &str_temp_2.
                               super_dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>
                               .elems,pvVar10,is_uppercase);
      dst = dst - local_60d8;
    }
    if ((show_base) && (1 < (long)dst)) {
      local_6189 = 'X';
      if (!is_uppercase) {
        local_6189 = 'x';
      }
      dst = dst - 1;
      pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                           local_60c0,(size_type)dst);
      *pvVar10 = local_6189;
      dst = dst - 1;
      pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                           local_60c0,(size_type)dst);
      *pvVar10 = '0';
    }
    if ((show_pos) && (0 < (long)dst)) {
      dst = dst - 1;
      pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                           local_60c0,(size_type)dst);
      *pvVar10 = '+';
    }
    if (field_width != 0) {
      sVar6 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::size
                        ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                         local_60c0);
      local_60e0 = (ulong)(sVar6 - 1);
      field_width = detail::min_unsafe<unsigned_long>(&field_width,&local_60e0);
      while (uVar2 = dst,
            sVar6 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::size
                              ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>
                                *)local_60c0), cVar1 = fill_char_str,
            (long)((sVar6 - 1) - field_width) < (long)uVar2) {
        dst = dst - 1;
        pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::
                  operator[]((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *
                             )local_60c0,(size_type)dst);
        *pvVar10 = cVar1;
      }
    }
    sVar6 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::size
                      ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                       local_60c0);
    pvVar10 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::operator[]
                        ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                         local_60c0,sVar6 - 1);
    *pvVar10 = '\0';
    pvVar11 = util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::data
                        ((dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                         local_60c0);
    detail::strcpy_unsafe<char*,char*>(str_result,pvVar11 + dst);
    detail::fixed_dynamic_array<char,_8200U,_std::allocator<unsigned_int>_>::~fixed_dynamic_array
              ((fixed_dynamic_array<char,_8200U,_std::allocator<unsigned_int>_> *)local_60c0);
  }
  else {
    local_1d = false;
  }
  return local_1d;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }